

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serialize.cpp
# Opt level: O3

void __thiscall chatra::Reader::Reader(Reader *this,RuntimeImp *runtime)

{
  PointerInfo local_18;
  
  this->runtime = runtime;
  this->buffer = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  this->offset = 0;
  (this->chunks)._M_h._M_buckets = &(this->chunks)._M_h._M_single_bucket;
  (this->chunks)._M_h._M_bucket_count = 1;
  (this->chunks)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->chunks)._M_h._M_element_count = 0;
  (this->chunks)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->classMap).super__Vector_base<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->classMap).super__Vector_base<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->classMap).super__Vector_base<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->chunks)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->chunks)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->pointerList).
  super__Vector_base<chatra::Reader::PointerInfo,_std::allocator<chatra::Reader::PointerInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pointerList).
  super__Vector_base<chatra::Reader::PointerInfo,_std::allocator<chatra::Reader::PointerInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->pointerList).
           super__Vector_base<chatra::Reader::PointerInfo,_std::allocator<chatra::Reader::PointerInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->pointerList).
           super__Vector_base<chatra::Reader::PointerInfo,_std::allocator<chatra::Reader::PointerInfo>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->rootMap)._M_h._M_buckets = &(this->rootMap)._M_h._M_single_bucket;
  (this->rootMap)._M_h._M_bucket_count = 1;
  (this->rootMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->rootMap)._M_h._M_element_count = 0;
  (this->rootMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->rootMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->rootMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->nodeClassMap)._M_h._M_buckets = &(this->nodeClassMap)._M_h._M_single_bucket;
  (this->nodeClassMap)._M_h._M_bucket_count = 1;
  (this->nodeClassMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->nodeClassMap)._M_h._M_element_count = 0;
  (this->nodeClassMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->nodeClassMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->nodeClassMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->nodeMethodMap)._M_h._M_buckets = &(this->nodeMethodMap)._M_h._M_single_bucket;
  (this->nodeMethodMap)._M_h._M_bucket_count = 1;
  (this->nodeMethodMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->nodeMethodMap)._M_h._M_element_count = 0;
  (this->nodeMethodMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->nodeMethodMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->nodeMethodMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->nodeMethodTableMap)._M_h._M_buckets = &(this->nodeMethodTableMap)._M_h._M_single_bucket;
  (this->nodeMethodTableMap)._M_h._M_bucket_count = 1;
  (this->nodeMethodTableMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->nodeMethodTableMap)._M_h._M_element_count = 0;
  (this->nodeMethodTableMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->nodeMethodTableMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->nodeMethodTableMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_18.mode = Raw;
  local_18.raw = (void *)0x0;
  std::vector<chatra::Reader::PointerInfo,_std::allocator<chatra::Reader::PointerInfo>_>::
  _M_realloc_insert<chatra::Reader::PointerInfo>(&this->pointerList,(iterator)0x0,&local_18);
  return;
}

Assistant:

Reader::Reader(RuntimeImp& runtime) noexcept : runtime(runtime) {
#ifdef CHATRA_NDEBUG
	pointerList.emplace_back(PointerInfo{PointerMode::Raw, nullptr});
#else
	pointerList.emplace_back(PointerInfo{PointerMode::Raw, nullptr, static_cast<PointerType>(0)});
#endif
}